

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

uint objgetap0(mcmcxdef *ctx,objnum obj,prpnum prop,objnum *orn,int inh,dattyp *ortyp)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  dattyp *ortyp_00;
  undefined2 *in_RCX;
  undefined2 in_DX;
  undefined2 in_SI;
  mcmcxdef *in_RDI;
  int in_R8D;
  undefined4 *in_R9;
  int isdesc;
  objdef *objptr;
  uchar sclist [100];
  dattyp typ;
  uint retval;
  int found;
  ushort poff;
  objnum o1n;
  uchar *o1;
  objnum osavn;
  dattyp typsav;
  ushort psav;
  ushort sccnt;
  uchar *sc;
  undefined4 in_stack_ffffffffffffff1c;
  mcmon obj_00;
  mcmcxdef *in_stack_ffffffffffffff20;
  mcmcxdef *ctx_00;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  dattyp local_c8;
  objnum in_stack_ffffffffffffff3e;
  objdef *in_stack_ffffffffffffff40;
  mcmcxdef *in_stack_ffffffffffffff48;
  dattyp *in_stack_ffffffffffffff90;
  prpnum in_stack_ffffffffffffff9c;
  objnum in_stack_ffffffffffffff9e;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined2 local_52;
  undefined2 local_42;
  undefined4 local_40;
  ushort local_3c;
  short local_3a;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  uint local_4;
  
  local_40 = 5;
  local_42 = 0xffff;
  if ((in_R8D == 0) &&
     (local_4 = objgetp((mcmcxdef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff90), local_4 != 0)) {
    if (in_RCX != (undefined2 *)0x0) {
      *in_RCX = in_SI;
    }
    if (in_R9 != (undefined4 *)0x0) {
      *in_R9 = in_stack_ffffffffffffffa0;
    }
  }
  else {
    puVar4 = mcmlck((mcmcxdef *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                    (mcmon)((ulong)in_stack_ffffffffffffff20 >> 0x30));
    uVar2 = osrp2(puVar4 + 4);
    memcpy(&local_c8,puVar4 + 0xe,(long)(int)((uVar2 & 0xffff) << 1));
    ortyp_00 = &local_c8;
    obj_00 = (mcmon)((uint)in_stack_ffffffffffffff1c >> 0x10);
    mcmunlck(in_stack_ffffffffffffff20,obj_00);
    bVar1 = false;
    for (local_3a = (short)uVar2; local_3a != 0; local_3a = local_3a + -1) {
      ctx_00 = in_RDI;
      osrp2(ortyp_00);
      uVar3 = objgetap0((mcmcxdef *)CONCAT26(in_SI,CONCAT24(in_DX,in_stack_ffffffffffffffe8)),
                        (objnum)((ulong)in_RCX >> 0x30),(prpnum)((ulong)in_RCX >> 0x20),
                        (objnum *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                        (int)((ulong)in_R9 >> 0x20),ortyp_00);
      if ((ushort)uVar3 != 0) {
        if (bVar1) {
          mcmlck((mcmcxdef *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 (mcmon)((ulong)ctx_00 >> 0x30));
          in_stack_ffffffffffffff2c =
               objisd(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3e)
          ;
          mcmunlck(ctx_00,obj_00);
          if (in_stack_ffffffffffffff2c == 0) goto LAB_0014ae99;
        }
        local_42 = local_52;
        bVar1 = true;
        local_40 = in_stack_ffffffffffffffa0;
        local_3c = (ushort)uVar3;
      }
LAB_0014ae99:
      ortyp_00 = (dattyp *)((long)ortyp_00 + 2);
    }
    if (in_RCX != (undefined2 *)0x0) {
      *in_RCX = local_42;
    }
    if (in_R9 != (undefined4 *)0x0) {
      *in_R9 = local_40;
    }
    if (bVar1) {
      local_4 = (uint)local_3c;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static uint objgetap0(mcmcxdef *ctx, noreg objnum obj, prpnum prop,
                      objnum *orn, int inh, dattyp *ortyp)
{
    uchar  *sc;
    ushort  sccnt;
    ushort  psav;
    dattyp  typsav = DAT_NIL;
    objnum  osavn = MCMONINV;
    uchar  *o1;
    objnum  o1n;
    ushort  poff;
    int     found;
    uint    retval;
    dattyp  typ;
    uchar   sclist[100];                           /* up to 50 superclasses */
    objdef *objptr;
    
    NOREG((&obj))
    
    /* see if the property is in the current object first */
    if (!inh && (retval = objgetp(ctx, obj, prop, &typ)) != 0)
    {
        /* 
         *   tell the caller which object this came from, if the caller
         *   wants to know 
         */
        if (orn != 0)
            *orn = obj;

        /* if the caller wants to know the type, return it */
        if (ortyp != 0)
            *ortyp = typ;

        /* return the property offset */
        return retval;
    }
    
    /* lock the object, cache its superclass list, and unlock it */
    objptr = (objdef *)mcmlck(ctx, (mcmon)obj);
    sccnt = objnsc(objptr);
    memcpy(sclist, objsc(objptr), (size_t)(sccnt << 1));
    sc = sclist;
    mcmunlck(ctx, (mcmon)obj);
    
    /* try to inherit the property */
    for (found = FALSE ; sccnt != 0 ; sc += 2, --sccnt)
    {
        /* recursively look up the property in this superclass */
        poff = objgetap0(ctx, (objnum)osrp2(sc), prop, &o1n, FALSE, &typ);

        /* if we found the property, remember it */
        if (poff != 0)
        {
            int isdesc;
            
            /* if we have a previous object, determine lineage */
            if (found)
            {
                o1 = mcmlck(ctx, o1n);
                isdesc = objisd(ctx, o1, osavn);
                mcmunlck(ctx, o1n);
            }
            
            /*
             *   if we don't already have a property, or the new object
             *   is a descendant of the previously found object (meaning
             *   that the new object's property should override the
             *   previously found object's property), use this new
             *   property 
             */
            if (!found || isdesc)
            {
                psav = poff;
                osavn = o1n;
                typsav = typ;
                found = TRUE;
            }
        }
    }

    /* set return pointer and return the offset of what we found */
    if (orn != 0)
        *orn = osavn;

    /* return the object type if the caller wanted it */
    if (ortyp != 0)
        *ortyp = typsav;

    /* return the offset of the property if we found one, or zero if not */
    return (found ? psav : 0);
}